

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

void Saig_ManBmcSectionsTest(Aig_Man_t *p)

{
  int iVar1;
  void **ppvVar2;
  void *__ptr;
  Vec_Vec_t *__ptr_00;
  int level;
  ulong uVar3;
  ulong uVar4;
  
  __ptr_00 = Saig_ManBmcSections(p);
  level = (int)p;
  iVar1 = __ptr_00->nSize;
  uVar3 = (ulong)iVar1;
  if (0 < (long)uVar3) {
    ppvVar2 = __ptr_00->pArray;
    uVar4 = 0;
    do {
      Abc_Print((int)p,"%d=%d ",uVar4 & 0xffffffff,(ulong)*(uint *)((long)ppvVar2[uVar4] + 4));
      level = (int)p;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  Abc_Print(level,"\n");
  if (0 < iVar1) {
    ppvVar2 = __ptr_00->pArray;
    uVar4 = 0;
    do {
      __ptr = ppvVar2[uVar4];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
          *(undefined8 *)((long)__ptr + 8) = 0;
        }
        free(__ptr);
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  if (__ptr_00->pArray != (void **)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (void **)0x0;
  }
  if (__ptr_00 != (Vec_Vec_t *)0x0) {
    free(__ptr_00);
    return;
  }
  return;
}

Assistant:

void Saig_ManBmcSectionsTest( Aig_Man_t * p )
{
    Vec_Vec_t * vSects;
    Vec_Ptr_t * vOne;
    int i;
    vSects = Saig_ManBmcSections( p );
    Vec_VecForEachLevel( vSects, vOne, i )
        Abc_Print( 1, "%d=%d ", i, Vec_PtrSize(vOne) );
    Abc_Print( 1, "\n" );
    Vec_VecFree( vSects );
}